

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::FieldDescriptor>
          (DescriptorBuilder *this,Edition edition,Proto *proto,FieldDescriptor *descriptor,
          OptionsType *options,FlatAllocator *alloc,ErrorLocation error_location,bool force_merge)

{
  Tables *pTVar1;
  ushort *puVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar3;
  OneofDescriptor *pOVar4;
  Descriptor *pDVar5;
  FeatureSet **ppFVar6;
  FeatureSet *pFVar7;
  ConstType pCVar8;
  MutableType this_00;
  size_t sVar9;
  FeatureSet *pFVar10;
  string_view element_name;
  string_view element_name_00;
  FeatureSet base_features;
  StatusOr<google::protobuf::FeatureSet> *local_90;
  StatusOr<google::protobuf::FeatureSet> merged;
  
  pOVar4 = FieldDescriptor::containing_oneof(descriptor);
  if (pOVar4 == (OneofDescriptor *)0x0) {
    if ((descriptor->field_0x1 & 8) == 0) {
      pDVar5 = descriptor->containing_type_;
    }
    else {
      pDVar5 = FieldDescriptor::extension_scope(descriptor);
      if (pDVar5 == (Descriptor *)0x0) {
        ppFVar6 = &descriptor->file_->merged_features_;
        goto LAB_001ff463;
      }
      pDVar5 = FieldDescriptor::extension_scope(descriptor);
    }
    ppFVar6 = &pDVar5->merged_features_;
  }
  else {
    pOVar4 = FieldDescriptor::containing_oneof(descriptor);
    ppFVar6 = &pOVar4->merged_features_;
  }
LAB_001ff463:
  pFVar10 = *ppFVar6;
  descriptor->proto_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  descriptor->merged_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  if ((this->feature_resolver_).
      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged != false) {
    bVar3 = FieldOptions::has_features(options);
    if (bVar3) {
      pTVar1 = this->tables_;
      pFVar7 = FieldOptions::mutable_features(options);
      pFVar7 = DescriptorPool::Tables::InternFeatureSet(pTVar1,pFVar7);
      descriptor->proto_features_ = pFVar7;
      FieldOptions::clear_features(options);
    }
    FeatureSet::FeatureSet(&base_features,descriptor->proto_features_);
    if (((int)edition < 1000) &&
       (descriptor->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_)) {
      puVar2 = (ushort *)(descriptor->all_names_).payload_;
      element_name._M_len = (ulong)*puVar2;
      element_name._M_str = (char *)((long)puVar2 + ~element_name._M_len);
      AddError(this,element_name,&proto->super_Message,error_location,
               "Features are only valid under editions.");
    }
    pCVar8 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                       (&base_features,
                        (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                         *)&pb::cpp);
    if (((undefined1  [16])((undefined1  [16])pCVar8->field_0 & (undefined1  [16])0x1) ==
         (undefined1  [16])0x0) && ((options->field_0)._impl_.ctype_ == 1)) {
      this_00 = FeatureSet::
                MutableExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,(unsigned_char)11,false>
                          (&base_features,
                           (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                            *)&pb::cpp);
      pb::CppFeatures::set_string_type(this_00,CppFeatures_StringType_CORD);
    }
    if ((int)edition < 1000) {
      if ((proto->field_0)._impl_.label_ == 2) {
        FeatureSet::set_field_presence(&base_features,FeatureSet_FieldPresence_LEGACY_REQUIRED);
      }
      if ((proto->field_0)._impl_.type_ == 10) {
        FeatureSet::set_message_encoding(&base_features,FeatureSet_MessageEncoding_DELIMITED);
      }
      if ((options->field_0)._impl_.packed_ == true) {
        FeatureSet::set_repeated_field_encoding
                  (&base_features,FeatureSet_RepeatedFieldEncoding_PACKED);
      }
      if (((edition == EDITION_PROTO3) && ((*(byte *)((long)&options->field_0 + 0x18) & 8) != 0)) &&
         ((options->field_0)._impl_.packed_ == false)) {
        FeatureSet::set_repeated_field_encoding
                  (&base_features,FeatureSet_RepeatedFieldEncoding_EXPANDED);
      }
    }
    sVar9 = FeatureSet::ByteSizeLong(&base_features);
    if (sVar9 == 0 && !force_merge) {
      descriptor->merged_features_ = pFVar10;
    }
    else {
      FeatureResolver::MergeFeatures
                (&merged,(FeatureResolver *)&this->feature_resolver_,pFVar10,&base_features);
      if (merged.super_StatusOrData<google::protobuf::FeatureSet>.field_0 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1) {
        pTVar1 = this->tables_;
        absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::EnsureOk
                  (&merged.super_StatusOrData<google::protobuf::FeatureSet>);
        pFVar10 = DescriptorPool::Tables::InternFeatureSet
                            (pTVar1,&merged.super_StatusOrData<google::protobuf::FeatureSet>.field_1
                                     .data_);
        descriptor->merged_features_ = pFVar10;
      }
      else {
        puVar2 = (ushort *)(descriptor->all_names_).payload_;
        element_name_00._M_len = (ulong)*puVar2;
        element_name_00._M_str = (char *)((long)puVar2 + ~element_name_00._M_len);
        make_error.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::FieldDescriptor>(google::protobuf::Edition,google::protobuf::FieldDescriptor::Proto_const&,google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptor::OptionsType*,google::protobuf::internal::FlatAllocator&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,bool)::_lambda()_1_,std::__cxx11::string>
        ;
        make_error.ptr_.obj = &local_90;
        local_90 = &merged;
        AddError(this,element_name_00,&proto->super_Message,error_location,make_error);
      }
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
      ~StatusOrData(&merged.super_StatusOrData<google::protobuf::FeatureSet>);
    }
    FeatureSet::~FeatureSet(&base_features);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&merged,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x170a,"feature_resolver_.has_value()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&merged);
}

Assistant:

void DescriptorBuilder::ResolveFeaturesImpl(
    Edition edition, const typename DescriptorT::Proto& proto,
    DescriptorT* descriptor, typename DescriptorT::OptionsType* options,
    internal::FlatAllocator& alloc,
    DescriptorPool::ErrorCollector::ErrorLocation error_location,
    bool force_merge) {
  const FeatureSet& parent_features = GetParentFeatures(descriptor);
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();

  ABSL_CHECK(feature_resolver_.has_value());

  if (options->has_features()) {
    // Remove the features from the child's options proto to avoid leaking
    // internal details.
    descriptor->proto_features_ =
        tables_->InternFeatureSet(std::move(*options->mutable_features()));
    options->clear_features();
  }

  FeatureSet base_features = *descriptor->proto_features_;

  // Handle feature inference from proto2/proto3.
  if (IsLegacyEdition(edition)) {
    if (descriptor->proto_features_ != &FeatureSet::default_instance()) {
      AddError(descriptor->name(), proto, error_location,
               "Features are only valid under editions.");
    }
  }
  InferLegacyProtoFeatures(proto, *options, edition, base_features);

  if (base_features.ByteSizeLong() == 0 && !force_merge) {
    // Nothing to merge, and we aren't forcing it.
    descriptor->merged_features_ = &parent_features;
    return;
  }

  // Calculate the merged features for this target.
  absl::StatusOr<FeatureSet> merged =
      feature_resolver_->MergeFeatures(parent_features, base_features);
  if (!merged.ok()) {
    AddError(descriptor->name(), proto, error_location,
             [&] { return std::string(merged.status().message()); });
    return;
  }

  descriptor->merged_features_ = tables_->InternFeatureSet(*std::move(merged));
}